

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

void Ivy_NodeCompactCuts(Ivy_Store_t *pCutStore)

{
  int local_20;
  int local_1c;
  int k;
  int i;
  Ivy_Cut_t *pCut;
  Ivy_Store_t *pCutStore_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < pCutStore->nCuts; local_1c = local_1c + 1) {
    if (pCutStore->pCuts[local_1c].nSize != 0) {
      memcpy(pCutStore->pCuts + local_20,pCutStore->pCuts + local_1c,0x24);
      local_20 = local_20 + 1;
    }
  }
  pCutStore->nCuts = local_20;
  return;
}

Assistant:

void Ivy_NodeCompactCuts( Ivy_Store_t * pCutStore )
{
    Ivy_Cut_t * pCut;
    int i, k;
    for ( i = k = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        pCutStore->pCuts[k++] = *pCut;
    }
    pCutStore->nCuts = k;
}